

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessagesTestCase.cpp
# Opt level: O0

void __thiscall
SuiteMessageTests::TestrejectSetString::TestrejectSetString(TestrejectSetString *this)

{
  char *suiteName;
  TestrejectSetString *this_local;
  
  suiteName = SuiteMessageTests::UnitTestSuite::GetSuiteName();
  UnitTest::Test::Test
            (&this->super_Test,"rejectSetString",suiteName,
             "/workspace/llm4binary/github/license_all_cmakelists_25/marlowa[P]quickfix/src/C++/test/MessagesTestCase.cpp"
             ,0x2cf);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__TestrejectSetString_00458ef0;
  return;
}

Assistant:

TEST(rejectSetString)
{
  Reject object;

  object.setString
    ( "8=FIX.4.2\0019=36\00135=3\00145=73\001"
      "58=This Message SUCKS!!!\00110=029\001" );

  RefSeqNum refSeqNum;
  Text text;
  CHECK_EQUAL( 73, object.get( refSeqNum ) );
  CHECK_EQUAL( "This Message SUCKS!!!", object.get( text ) );
}